

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalTableStorage::AppendToDeleteIndexes
          (LocalTableStorage *this,Vector *row_ids,DataChunk *delete_chunk)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  pointer pIVar4;
  undefined4 extraout_var;
  BoundIndex *this_00;
  InternalException *this_01;
  pointer this_02;
  allocator local_109;
  pthread_mutex_t *local_108;
  IndexAppendInfo index_append_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  ErrorData result;
  
  if (delete_chunk->count != 0) {
    local_108 = (pthread_mutex_t *)&this->delete_indexes;
    ::std::mutex::lock((mutex *)&local_108->__data);
    puVar1 = (this->delete_indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (this->delete_indexes).indexes.
                   super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1;
        this_02 = this_02 + 1) {
      pIVar4 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                         (this_02);
      iVar3 = (*pIVar4->_vptr_Index[2])(pIVar4);
      if ((char)iVar3 != '\0') {
        pIVar4 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                           (this_02);
        iVar3 = (*pIVar4->_vptr_Index[3])(pIVar4);
        bVar2 = ::std::operator==("ART",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(extraout_var,iVar3));
        if (bVar2) {
          this_00 = (BoundIndex *)
                    unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                              (this_02);
          iVar3 = (*(this_00->super_Index)._vptr_Index[5])(this_00);
          if ((byte)((char)iVar3 - 1U) < 2) {
            index_append_info.append_mode = IGNORE_DUPLICATES;
            index_append_info.delete_index.ptr = (BoundIndex *)0x0;
            BoundIndex::Append(&result,this_00,delete_chunk,row_ids,&index_append_info);
            if (result.initialized == true) {
              this_01 = (InternalException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_d0,"unexpected constraint violation on delete ART: ",
                         &local_109);
              ::std::__cxx11::string::string((string *)&local_f0,(string *)&result.final_message);
              InternalException::InternalException<std::__cxx11::string>
                        (this_01,&local_d0,&local_f0);
              __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            ErrorData::~ErrorData(&result);
          }
        }
      }
    }
    pthread_mutex_unlock(local_108);
  }
  return;
}

Assistant:

void LocalTableStorage::AppendToDeleteIndexes(Vector &row_ids, DataChunk &delete_chunk) {
	if (delete_chunk.size() == 0) {
		return;
	}

	delete_indexes.ScanBound<ART>([&](ART &art) {
		if (!art.IsUnique()) {
			return false;
		}
		IndexAppendInfo index_append_info(IndexAppendMode::IGNORE_DUPLICATES, nullptr);
		auto result = art.Cast<BoundIndex>().Append(delete_chunk, row_ids, index_append_info);
		if (result.HasError()) {
			throw InternalException("unexpected constraint violation on delete ART: ", result.Message());
		}
		return false;
	});
}